

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall NbhReadWriter::scanfile(NbhReadWriter *this)

{
  uint uVar1;
  uint8_t uVar2;
  bool bVar3;
  element_type *peVar4;
  mapped_type_conflict *pmVar5;
  mapped_type *pmVar6;
  size_t sVar7;
  pointer ppVar8;
  _Self local_e0;
  _Self local_d8;
  iterator i_1;
  _Self local_c8;
  iterator i;
  blockinfo blk;
  int local_84;
  uint64_t uStack_80;
  uint32_t ix;
  uint64_t logicalpos;
  uint64_t filepos;
  i32map_t ss_stats;
  i32map_t ds_stats;
  NbhReadWriter *this_local;
  
  std::
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::map((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
         *)&ss_stats._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::map((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
         *)&filepos);
  logicalpos = 0x17;
  uStack_80 = 0;
  local_84 = 0;
  do {
    peVar4 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    (*peVar4->_vptr_ReadWriter[4])(peVar4,logicalpos);
    blockinfo::blockinfo((blockinfo *)&i);
    i._M_node._0_4_ = local_84;
    blk._0_8_ = logicalpos;
    blk.fileoffset = uStack_80;
    peVar4 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    blk.logicaloffset._0_4_ = ReadWriter::read32le(peVar4);
    peVar4 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    blk.logicaloffset._4_4_ = ReadWriter::read32le(peVar4);
    peVar4 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    uVar2 = ReadWriter::read8(peVar4);
    blk.datasize._0_1_ = uVar2;
    if (g_verbose != 0) {
      pmVar5 = std::
               map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
               ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                             *)&ss_stats._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)&blk.logicaloffset);
      *pmVar5 = *pmVar5 + 1;
      pmVar5 = std::
               map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
               ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                             *)&filepos,(key_type *)((long)&blk.logicaloffset + 4));
      *pmVar5 = *pmVar5 + 1;
    }
    pmVar6 = std::
             map<unsigned_long,_NbhReadWriter::blockinfo,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_NbhReadWriter::blockinfo>_>_>
             ::operator[](&this->_blocks,&stack0xffffffffffffff80);
    pmVar6->flag = (uint8_t)blk.datasize;
    pmVar6->modified = (bool)blk.datasize._1_1_;
    pmVar6->logicaloffset = blk.fileoffset;
    pmVar6->datasize = (uint32_t)blk.logicaloffset;
    pmVar6->sigsize = blk.logicaloffset._4_4_;
    *(ulong *)pmVar6 = CONCAT44(i._M_node._4_4_,(int)i._M_node);
    pmVar6->fileoffset = blk._0_8_;
    sVar7 = blockinfo::physicalsize((blockinfo *)&i);
    logicalpos = sVar7 + logicalpos;
    uStack_80 = (uint32_t)blk.logicaloffset + uStack_80;
    local_84 = local_84 + 1;
  } while ((uint8_t)blk.datasize != '\x02');
  if (g_verbose != 0) {
    printf("ds: ");
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
         ::begin((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                  *)&ss_stats._M_t._M_impl.super__Rb_tree_header._M_node_count);
    while( true ) {
      i_1 = std::
            map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
            ::end((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   *)&ss_stats._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar3 = std::operator!=(&local_c8,&i_1);
      if (!bVar3) break;
      ppVar8 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator->(&local_c8);
      uVar1 = ppVar8->first;
      ppVar8 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator->(&local_c8);
      printf(" %08x:%d",(ulong)uVar1,(ulong)(uint)ppVar8->second);
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator++(&local_c8);
    }
    printf("\n");
    printf("ss: ");
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
         ::begin((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                  *)&filepos);
    while( true ) {
      local_e0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::end((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                  *)&filepos);
      bVar3 = std::operator!=(&local_d8,&local_e0);
      if (!bVar3) break;
      ppVar8 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator->(&local_d8);
      uVar1 = ppVar8->first;
      ppVar8 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator->(&local_d8);
      printf(" %08x:%d",(ulong)uVar1,(ulong)(uint)ppVar8->second);
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator++(&local_d8);
    }
    printf("\n");
  }
  std::
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~map((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          *)&filepos);
  std::
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~map((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          *)&ss_stats._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void scanfile()
    {
        typedef std::map<uint32_t,int> i32map_t;
        i32map_t ds_stats;
        i32map_t ss_stats;
        uint64_t filepos= 0x17;
        uint64_t logicalpos= 0;
        uint32_t ix= 0;
        while (true)
        {
            _r->setpos(filepos);

            blockinfo blk;
            blk.ix= ix;
            blk.fileoffset= filepos;
            blk.logicaloffset= logicalpos;
            blk.datasize= _r->read32le();
            blk.sigsize= _r->read32le();
            blk.flag= _r->read8();

            if (g_verbose) {
                ds_stats[blk.datasize]++;
                ss_stats[blk.sigsize]++;
            }

            _blocks[logicalpos]= blk;

            filepos+= blk.physicalsize();
            logicalpos+= blk.datasize;
            ix++;

            if (blk.flag==2)
                break;
        }
        if (g_verbose) {
            printf("ds: ");
            for (auto i= ds_stats.begin() ; i!=ds_stats.end() ; ++i)
                printf(" %08x:%d", i->first, i->second);
            printf("\n");
            printf("ss: ");
            for (auto i= ss_stats.begin() ; i!=ss_stats.end() ; ++i)
                printf(" %08x:%d", i->first, i->second);
            printf("\n");
        }
    }